

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::hold(TestMoreStuffImpl *this,HoldContext context)

{
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Client local_68;
  undefined1 local_50 [8];
  Reader params;
  TestMoreStuffImpl *this_local;
  HoldContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  params._reader._40_8_ = context.hook;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::getParams((Reader *)local_50,
              (CallContext<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
               *)&this_local);
  capnproto_test::capnp::test::TestMoreStuff::HoldParams::Reader::getCap
            (&local_68,(Reader *)local_50);
  capnproto_test::capnp::test::TestInterface::Client::operator=
            ((Client *)(context.hook + 3),&local_68);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_68);
  kj::Promise<void>::Promise((Promise<void> *)this);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::hold(HoldContext context) {
  ++callCount;

  auto params = context.getParams();
  clientToHold = params.getCap();
  return kj::READY_NOW;
}